

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATrie.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  DNATrie *pDVar3;
  DNAChunk cnk;
  DNAChunk cnk3;
  DNAChunk cnk2;
  DNATrie local_40;
  
  if (argc == 2) {
    iVar1 = strcmp(argv[1],"test");
    if (iVar1 == 0) {
      gTester._failures = 0;
      DNAChunk::DNAChunk(&cnk,"AGCTT");
      local_40._count = 0xffffffffffffffff;
      local_40._root.count = 0;
      local_40._root.childNodes[0] = (DNANode *)0x0;
      local_40._root.childNodes[1] = (DNANode *)0x0;
      local_40._root.childNodes[2] = (DNANode *)0x0;
      DNANode::insert((DNANode *)&local_40,cnk.dna,cnk.dsize,false);
      gTester._failures =
           gTester._failures + (local_40._root.count == 0) +
           (uint)(*(long *)(local_40._root.count + 0x18) == 0);
      DNANode::~DNANode((DNANode *)&local_40);
      DNAChunk::~DNAChunk(&cnk);
      DNAChunk::DNAChunk(&cnk,"ACGTT");
      DNAChunk::DNAChunk(&cnk2,"ACGTT");
      DNAChunk::DNAChunk(&cnk3,"ACGTTAAA");
      local_40._count = 0xffffffffffffffff;
      local_40._root.count = 0;
      local_40._root.childNodes[0] = (DNANode *)0x0;
      local_40._root.childNodes[1] = (DNANode *)0x0;
      local_40._root.childNodes[2] = (DNANode *)0x0;
      DNANode::insert((DNANode *)&local_40,cnk.dna,cnk.dsize,false);
      DNANode::insert((DNANode *)&local_40,cnk2.dna,cnk2.dsize,false);
      DNANode::insert((DNANode *)&local_40,cnk3.dna,cnk3.dsize,false);
      lVar2 = DNANode::find((DNANode *)&local_40,cnk.dna,cnk.dsize);
      gTester._failures = gTester._failures + (lVar2 != 1);
      DNANode::~DNANode((DNANode *)&local_40);
      DNAChunk::~DNAChunk(&cnk3);
      DNAChunk::~DNAChunk(&cnk2);
      DNAChunk::~DNAChunk(&cnk);
      local_40._count = 0;
      local_40._root.count = -1;
      local_40._root.childNodes[0] = (DNANode *)0x0;
      local_40._root.childNodes[1] = (DNANode *)0x0;
      local_40._root.childNodes[2] = (DNANode *)0x0;
      local_40._root.childNodes[3] = (DNANode *)0x0;
      pDVar3 = DNATrie::operator<<(&local_40,"ACGGTT");
      pDVar3 = DNATrie::operator<<(pDVar3,"GCCTTTAA");
      DNATrie::operator<<(pDVar3,"AGGCC");
      gTester._failures = gTester._failures + (local_40._count != 3);
      DNANode::~DNANode(&local_40._root);
      TestObject::finish(&gTester);
    }
    return 0;
  }
  fprintf(_stderr,"Must specify mode, got %d args\n",(ulong)(uint)argc);
  exit(2);
}

Assistant:

int main(int argc, char const* argv[])
{
	if (argc != 2) {
		std::fprintf(stderr, "Must specify mode, got %d args\n", argc);
		std::exit(2);
	}
    if (std::strcmp(argv[1], "test") == 0) {
        gTester.clear();
        testDNANodeInsert();
        testDNANodeFind();
        testDNATrieLeftShift();
        gTester.finish();
    }
    return 0;
}